

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall AI::canrev(AI *this,int i,int j,int who)

{
  pair<int,_int> *ppVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  bool bVar4;
  
  if (-1 < i) {
    if (((-1 < j && (ulong)(uint)i < this->boardSize) && ((ulong)(uint)j < this->boardSize)) &&
       (*(int *)(*(long *)&(this->board->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[(uint)i].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + (ulong)(uint)j * 4) == 0)) {
      ppVar3 = (this->directions).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->directions).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = ppVar3 != ppVar1;
      if (!bVar4) {
        return bVar4;
      }
      iVar2 = reverseDirection(this,i,j,who,*ppVar3,false);
      while( true ) {
        if (iVar2 != 0) {
          return bVar4;
        }
        ppVar3 = ppVar3 + 1;
        bVar4 = ppVar3 != ppVar1;
        if (ppVar3 == ppVar1) break;
        iVar2 = reverseDirection(this,i,j,who,*ppVar3,false);
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool AI::canrev(int i, int j, int who) {
    if (i < 0 || i >= boardSize || j < 0 || j >= boardSize) return false;
    if (board[i][j] != EMPTY) return false;
    for (auto &dir: directions) {
        int num = reverseDirection(i, j, who, dir);
        if (num) return true;
    }
    return false;
}